

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_uint64 cur_file_ofs;
  mz_zip_internal_state *pArray;
  tdefl_compressor *d;
  size_t sVar1;
  mz_bool mVar2;
  tdefl_status tVar3;
  mz_uint32 mVar4;
  mz_uint64 *pmVar5;
  size_t sVar6;
  size_t sVar7;
  undefined4 extraout_var;
  sbyte sVar8;
  ulong uVar9;
  mz_uint64 *pmVar10;
  mz_uint64 *pmVar11;
  char cVar12;
  sbyte sVar13;
  ushort uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  sbyte sVar19;
  int iVar20;
  undefined1 uVar21;
  char *pcVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  bool bVar26;
  mz_uint64 local_138;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint64 comp_size;
  mz_uint8 *local_120;
  tdefl_compressor *local_118;
  size_t local_110;
  size_t local_108;
  char *local_100;
  mz_zip_writer_add_state state;
  mz_uint64 local_dir_header_ofs;
  int local_d4;
  uint local_d0;
  uint local_cc;
  ulong local_c8;
  ulong local_c0;
  time_t cur_time;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined2 local_aa;
  undefined6 uStack_a8;
  long lStack_a2;
  undefined8 local_98;
  mz_uint8 *local_90;
  mz_ulong local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  ulong local_68;
  void *local_60;
  mz_uint8 extra_data [28];
  
  dos_time = 0;
  dos_date = 0;
  cur_file_ofs = pZip->m_archive_size;
  comp_size = 0;
  uVar24 = 6;
  if (-1 < (int)level_and_flags) {
    uVar24 = level_and_flags;
  }
  if (uncomp_size == 0) {
    uVar14 = (ushort)((uVar24 & 0x400) == 0 && buf_size != 0) << 3;
  }
  else {
    uVar14 = 8;
  }
  uVar23 = uVar24 & 0x400;
  local_c0 = (ulong)uVar14;
  if ((uVar24 >> 0x10 & 1) == 0) {
    local_c0 = (ulong)(uVar14 + 0x800);
  }
  uVar25 = uVar24 & 0xf;
  pArray = pZip->m_pState;
  if ((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
LAB_00109f2f:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if ((pArchive_name == (char *)0x0) ||
     ((pBuf == (void *)0x0 && buf_size != 0 ||
      (pComment == (void *)0x0 && comment_size != 0 || 10 < uVar25)))) goto LAB_00109f2f;
  if (pArray->m_zip64 == 0) {
    if ((uncomp_size | buf_size) >> 0x20 != 0 || pZip->m_total_files == 0xffff) {
      pArray->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  if (uncomp_size != 0 && uVar23 == 0) goto LAB_00109f2f;
  cVar12 = *pArchive_name;
  if (cVar12 == '/') {
LAB_00109fbd:
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  local_88 = (mz_ulong)uncomp_crc32;
  local_70 = (undefined1 *)((long)&state.m_cur_archive_file_ofs + 7);
  local_78 = (undefined1 *)((long)&state.m_cur_archive_file_ofs + 6);
  local_80 = (undefined1 *)((long)&state.m_cur_archive_file_ofs + 5);
  pcVar22 = pArchive_name + 1;
  while (cVar12 != '\0') {
    if ((cVar12 == ':') || (cVar12 == '\\')) {
      if (pZip == (mz_zip_archive *)0x0) {
        return 0;
      }
      goto LAB_00109fbd;
    }
    cVar12 = *pcVar22;
    pcVar22 = pcVar22 + 1;
  }
  local_108 = buf_size;
  local_100 = pArchive_name;
  local_dir_header_ofs = cur_file_ofs;
  local_90 = (mz_uint8 *)pBuf;
  local_60 = pComment;
  if (last_modified == (time_t *)0x0) {
    time(&cur_time);
  }
  else {
    cur_time = *last_modified;
  }
  mz_zip_time_t_to_dos_time(cur_time,&dos_time,&dos_date);
  local_110 = strlen(local_100);
  if (0xffff < local_110) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
      return 0;
    }
    return 0;
  }
  if (pZip->m_file_offset_alignment == 0) {
    uVar15 = 0;
  }
  else {
    iVar18 = (int)pZip->m_file_offset_alignment;
    uVar15 = iVar18 - 1;
    uVar15 = iVar18 - ((uint)pZip->m_archive_size & uVar15) & uVar15;
  }
  sVar6 = (pArray->m_central_dir).m_size;
  uVar9 = (ulong)comment_size;
  if (0xfffffffe < sVar6 + uVar9 + local_110 + 0x4a) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  lVar16 = 0x1c;
  if (pArray->m_zip64 == 0) {
    if ((pZip->m_archive_size +
        (ulong)user_extra_data_central_len + (ulong)user_extra_data_len + uVar9 + local_110 * 2 +
        (ulong)uVar15 + sVar6) - 0xffffff8e < 0xffffffff00000000) {
      pArray->m_zip64 = 1;
    }
    else {
      lVar16 = 0;
    }
  }
  local_98 = 0;
  if (((local_110 != 0) && (local_100[local_110 - 1] == '/')) &&
     (local_98 = 0x10, uncomp_size != 0 || local_108 != 0)) goto LAB_00109f2f;
  uVar17 = lVar16 + uVar9 + local_110 + sVar6 + 0x2e;
  if ((((pArray->m_central_dir).m_capacity < uVar17) &&
      (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar17,1), mVar2 == 0)) ||
     ((uVar17 = (pArray->m_central_dir_offsets).m_size + 1,
      (pArray->m_central_dir_offsets).m_capacity < uVar17 &&
      (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar17,1),
      mVar2 == 0)))) {
LAB_0010a268:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  if (local_108 != 0 && (uVar25 != 0 && uVar23 == 0)) {
    local_118 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_118 == (tdefl_compressor *)0x0) goto LAB_0010a268;
  }
  else {
    local_118 = (tdefl_compressor *)0x0;
  }
  mVar2 = mz_zip_writer_write_zeros(pZip,cur_file_ofs,uVar15);
  if (mVar2 == 0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
    return 0;
  }
  local_dir_header_ofs = local_dir_header_ofs + uVar15;
  local_68 = uVar9;
  if ((pZip->m_file_offset_alignment != 0) &&
     ((pZip->m_file_offset_alignment - 1 & local_dir_header_ofs) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                  ,0x17fb,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  uVar9 = cur_file_ofs + uVar15;
  uStack_a8 = 0;
  lStack_a2 = 0;
  cur_time = 0;
  local_b0 = 0;
  local_af = 0;
  local_ae = 0;
  local_ad = 0;
  local_ac = 0;
  local_ab = 0;
  local_aa = 0;
  bVar26 = (uVar24 & 0x40f) != 0;
  iVar18 = (uint)bVar26 << 3;
  local_d4 = iVar18;
  if (pArray->m_zip64 == 0) {
    if ((comp_size._4_4_ != 0) || (uVar9 >> 0x20 != 0)) goto LAB_0010a76d;
    uVar21 = 0x14;
    if (!bVar26) {
      uVar21 = 0;
    }
    cur_time._0_5_ = CONCAT14(uVar21,0x4034b50);
    cur_time._0_6_ = (uint6)(uint5)cur_time;
    cur_time._0_7_ = CONCAT16((char)local_c0,(uint6)cur_time);
    cur_time = CONCAT17((char)(local_c0 >> 8),(undefined7)cur_time);
    local_cc = (uint)dos_time;
    local_ae = (undefined1)dos_time;
    local_ad = (undefined1)(dos_time >> 8);
    local_ac = (undefined1)dos_date;
    local_d0 = (uint)dos_date;
    local_ab = (undefined1)(dos_date >> 8);
    local_aa = 0;
    uStack_a8 = 0;
    lStack_a2 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,(short)local_110)) << 0x20;
    local_b0 = (char)iVar18;
    sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    sVar1 = local_110;
    if (sVar6 != 0x1e) goto LAB_0010a4f9;
    sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar9 + 0x1e,local_100,local_110);
    if (sVar6 == sVar1) {
      local_138 = uVar9 + 0x1e + local_110;
      local_120 = (mz_uint8 *)0x0;
      local_c8 = 0;
      goto LAB_0010a50e;
    }
LAB_0010a4ed:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
LAB_0010a4f9:
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    return 0;
  }
  if ((uncomp_size < 0xffffffff) && (local_dir_header_ofs < 0xffffffff)) {
    local_120 = (mz_uint8 *)0x0;
    local_c8 = 0;
  }
  else {
    pmVar10 = (mz_uint64 *)0x0;
    pmVar5 = &uncomp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar5 = pmVar10;
    }
    pmVar11 = &comp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar11 = pmVar10;
    }
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar10 = &local_dir_header_ofs;
    }
    local_120 = extra_data;
    mVar4 = mz_zip_writer_create_zip64_extra_data(local_120,pmVar5,pmVar11,pmVar10);
    local_c8 = (ulong)mVar4;
  }
  sVar1 = local_110;
  iVar20 = (int)local_c8 + user_extra_data_len;
  uVar21 = 0x14;
  if (!bVar26) {
    uVar21 = 0;
  }
  cur_time._0_5_ = CONCAT14(uVar21,0x4034b50);
  cur_time._0_6_ = (uint6)(uint5)cur_time;
  cur_time._0_7_ = CONCAT16((char)local_c0,(uint6)cur_time);
  cur_time = CONCAT17((char)(local_c0 >> 8),(undefined7)cur_time);
  local_af = 0;
  local_ae = (undefined1)dos_time;
  local_cc = (uint)dos_time;
  local_ad = (undefined1)(dos_time >> 8);
  local_ac = (undefined1)dos_date;
  local_d0 = (uint)dos_date;
  local_ab = (undefined1)(dos_date >> 8);
  local_aa = 0;
  uStack_a8 = 0;
  lStack_a2 = (ulong)CONCAT13((char)((uint)iVar20 >> 8),CONCAT12((char)iVar20,(short)local_110)) <<
              0x20;
  local_b0 = (char)iVar18;
  sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
  if (sVar6 != 0x1e) goto LAB_0010a4f9;
  sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar9 + 0x1e,local_100,sVar1);
  if (sVar6 != sVar1) goto LAB_0010a4ed;
  local_138 = uVar9 + 0x1e + sVar1;
  if (local_120 == (mz_uint8 *)0x0) {
    local_120 = (mz_uint8 *)0x0;
  }
  else {
    uVar9 = local_c8 & 0xffffffff;
    sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_138,extra_data,uVar9);
    if (sVar6 != uVar9) goto LAB_0010a6d3;
    local_138 = local_138 + uVar9;
  }
LAB_0010a50e:
  if (user_extra_data_len != 0) {
    uVar9 = (ulong)user_extra_data_len;
    sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_138,user_extra_data,uVar9);
    if (sVar6 != uVar9) goto LAB_0010a6d3;
    local_138 = local_138 + uVar9;
  }
  sVar6 = local_108;
  if (uVar23 == 0) {
    local_88 = mz_crc32(0,local_90,local_108);
    d = local_118;
    uncomp_size = sVar6;
    if (sVar6 < 4 || (uVar25 == 0 || uVar23 != 0)) goto LAB_0010a58a;
    state.m_cur_archive_file_ofs = local_138;
    state.m_comp_size = 0;
    state.m_pZip = pZip;
    tdefl_init(local_118,mz_zip_writer_add_put_buf_callback,&state,
               (uint)(uVar25 < 4) << 0xe |
               tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar25]);
    tVar3 = tdefl_compress_buffer(d,local_90,local_108,TDEFL_FINISH);
    if (tVar3 != TDEFL_STATUS_DONE) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
      pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
      return 0;
    }
    local_138 = state.m_cur_archive_file_ofs;
    comp_size = state.m_comp_size;
  }
  else {
LAB_0010a58a:
    sVar6 = local_108;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_138,local_90,local_108);
    if (sVar7 != sVar6) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
LAB_0010a6d3:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    local_138 = local_138 + local_108;
    comp_size = local_108;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
  if (uncomp_size == 0) {
    uVar9 = 0;
  }
  else {
    if ((local_c0 & 8) == 0) {
      __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                    ,0x1873,
                    "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                   );
    }
    state.m_pZip = (mz_zip_archive *)
                   CONCAT17((char)(local_88 >> 0x18),
                            CONCAT16((char)(local_88 >> 0x10),
                                     CONCAT15((char)(local_88 >> 8),
                                              CONCAT14((char)local_88,0x8074b50))));
    uVar21 = (undefined1)uncomp_size;
    if (local_120 == (mz_uint8 *)0x0) {
      if (comp_size >> 0x20 != 0) {
LAB_0010a76d:
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
        return 0;
      }
      pmVar5 = &state.m_cur_archive_file_ofs;
      state.m_cur_archive_file_ofs = CONCAT44(state.m_cur_archive_file_ofs._4_4_,(int)comp_size);
      sVar19 = 0x18;
      sVar13 = 0x10;
      sVar8 = 8;
      sVar6 = 0x10;
    }
    else {
      pmVar5 = &state.m_comp_size;
      state.m_cur_archive_file_ofs = comp_size;
      state.m_comp_size._0_4_ = (undefined4)uncomp_size;
      uVar21 = (undefined1)(uncomp_size >> 0x20);
      sVar6 = 0x18;
      sVar19 = 0x38;
      sVar13 = 0x30;
      sVar8 = 0x28;
      local_80 = (undefined1 *)((long)&state.m_comp_size + 5);
      local_78 = (undefined1 *)((long)&state.m_comp_size + 6);
      local_70 = (undefined1 *)((long)&state.m_comp_size + 7);
    }
    *(undefined1 *)((long)pmVar5 + 4) = uVar21;
    *local_80 = (char)(uncomp_size >> sVar8);
    *local_78 = (char)(uncomp_size >> sVar13);
    *local_70 = (char)(uncomp_size >> sVar19);
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_138,&state,sVar6);
    if (sVar7 != sVar6) {
      return 0;
    }
    local_138 = local_138 + sVar6;
    uVar9 = uncomp_size;
  }
  if (local_120 != (mz_uint8 *)0x0) {
    pmVar5 = (mz_uint64 *)0x0;
    if (0xfffffffe < uVar9) {
      pmVar5 = &uncomp_size;
    }
    pmVar10 = &comp_size;
    if (uVar9 < 0xffffffff) {
      pmVar10 = (mz_uint64 *)0x0;
    }
    pmVar11 = (mz_uint64 *)0x0;
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar11 = &local_dir_header_ofs;
    }
    mVar4 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar5,pmVar10,pmVar11);
    local_c8 = CONCAT44(extraout_var,mVar4);
    uVar9 = uncomp_size;
  }
  mVar2 = mz_zip_writer_add_to_central_dir
                    (pZip,local_100,(mz_uint16)local_110,local_120,(mz_uint16)local_c8,local_60,
                     (mz_uint16)local_68,uVar9,comp_size,(mz_uint32)local_88,(mz_uint16)local_d4,
                     (mz_uint16)local_c0,(mz_uint16)local_cc,(mz_uint16)local_d0,
                     local_dir_header_ofs,(mz_uint32)local_98,user_extra_data_central,
                     user_extra_data_central_len);
  if (mVar2 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = local_138;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *pZip, const char *pArchive_name, const void *pBuf, size_t buf_size, const void *pComment, mz_uint16 comment_size,
                                    mz_uint level_and_flags, mz_uint64 uncomp_size, mz_uint32 uncomp_crc32, MZ_TIME_T *last_modified,
                                    const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 method = 0, dos_time = 0, dos_date = 0;
    mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
    mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    tdefl_compressor *pComp = NULL;
    mz_bool store_data_uncompressed;
    mz_zip_internal_state *pState;
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_uint16 bit_flags = 0;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;

    if (uncomp_size || (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
        bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    level = level_and_flags & 0xF;
    store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
        if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
    if (last_modified != NULL)
    {
        mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
    }
    else
    {
        MZ_TIME_T cur_time;
        time(&cur_time);
        mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
    }
#endif /* #ifndef MINIZ_NO_TIME */

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size 
			+ MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + user_extra_data_len + 
			pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/'))
    {
        /* Set DOS Subdirectory attribute bit. */
        ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

        /* Subdirectories cannot contain data. */
        if ((buf_size) || (uncomp_size))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.) */
    if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0))) || (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if ((!store_data_uncompressed) && (buf_size))
    {
        if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        return MZ_FALSE;
    }

    local_dir_header_ofs += num_alignment_padding_bytes;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }
    cur_archive_file_ofs += num_alignment_padding_bytes;

    MZ_CLEAR_OBJ(local_dir_header);

    if (!store_data_uncompressed || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
    {
        method = MZ_DEFLATED;
    }

    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, extra_size + user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;

        if (pExtra_data != NULL)
        {
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

            cur_archive_file_ofs += extra_size;
        }
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;
    }

    if (user_extra_data_len > 0)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += user_extra_data_len;
    }

    if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
    {
        uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
        uncomp_size = buf_size;
        if (uncomp_size <= 3)
        {
            level = 0;
            store_data_uncompressed = MZ_TRUE;
        }
    }

    if (store_data_uncompressed)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += buf_size;
        comp_size = buf_size;
    }
    else if (buf_size)
    {
        mz_zip_writer_add_state state;

        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = cur_archive_file_ofs;
        state.m_comp_size = 0;

        if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) ||
            (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) != TDEFL_STATUS_DONE))
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
        }

        comp_size = state.m_comp_size;
        cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    pComp = NULL;

    if (uncomp_size)
    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, extra_size, pComment,
                                          comment_size, uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}